

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
                 *this,GetterXsYs<unsigned_long_long> *getter1,
                GetterXsYRef<unsigned_long_long> *getter2,TransformerLogLin *transformer,ImU32 col)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  ImVec2 IVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  GetterXsYRef<unsigned_long_long> *pGVar6;
  TransformerLogLin *pTVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ImPlotContext *pIVar13;
  int iVar14;
  long lVar15;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar4 = getter1->Count;
  iVar14 = getter2->Count;
  if (iVar4 < getter2->Count) {
    iVar14 = iVar4;
  }
  this->Prims = iVar14 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar13 = GImPlot;
  (this->P12).y = 0.0;
  lVar15 = (long)((getter1->Offset % iVar4 + iVar4) % iVar4) * (long)getter1->Stride;
  uVar1 = *(unsigned_long_long *)((long)getter1->Xs + lVar15);
  uVar2 = *(unsigned_long_long *)((long)getter1->Ys + lVar15);
  dVar10 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar5 = pIVar13->CurrentPlot;
  dVar11 = (pIVar5->XAxis).Range.Min;
  iVar4 = transformer->YAxis;
  IVar3 = pIVar13->PixelRange[iVar4].Min;
  IVar8.y = (float)(pIVar13->My[iVar4] *
                    ((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                    pIVar5->YAxis[iVar4].Range.Min) + (double)IVar3.y);
  IVar8.x = (float)(pIVar13->Mx *
                    (((double)(float)(dVar10 / pIVar13->LogDenX) *
                      ((pIVar5->XAxis).Range.Max - dVar11) + dVar11) - dVar11) + (double)IVar3.x);
  this->P11 = IVar8;
  pIVar13 = GImPlot;
  pGVar6 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar4 = pGVar6->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar6->Xs +
           (long)((pGVar6->Offset % iVar4 + iVar4) % iVar4) * (long)pGVar6->Stride);
  dVar10 = pGVar6->YRef;
  dVar11 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar5 = pIVar13->CurrentPlot;
  dVar12 = (pIVar5->XAxis).Range.Min;
  iVar4 = pTVar7->YAxis;
  IVar3 = pIVar13->PixelRange[iVar4].Min;
  IVar9.y = (float)(pIVar13->My[iVar4] * (dVar10 - pIVar5->YAxis[iVar4].Range.Min) + (double)IVar3.y
                   );
  IVar9.x = (float)(pIVar13->Mx *
                    (((double)(float)(dVar11 / pIVar13->LogDenX) *
                      ((pIVar5->XAxis).Range.Max - dVar12) + dVar12) - dVar12) + (double)IVar3.x);
  this->P12 = IVar9;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }